

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

ssize_t __thiscall QMetaProperty::write(QMetaProperty *this,int __fd,void *__buf,size_t __n)

{
  uint *puVar1;
  uint *puVar2;
  StaticMetacallFunction p_Var3;
  QDynamicMetaObjectData *pQVar4;
  bool bVar5;
  QMetaObject *pQVar6;
  undefined8 uVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ssize_t sVar8;
  undefined7 extraout_var;
  int iVar9;
  uint uVar10;
  undefined4 in_register_00000034;
  QObject *object;
  char *pcVar11;
  long in_FS_OFFSET;
  _Optional_base<unsigned_long_long,_true,_true> _Var12;
  int flags;
  int status;
  QMetaType t;
  undefined4 local_70;
  int local_6c;
  QMetaType local_68;
  QMetaType local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined4 *local_40;
  long local_38;
  
  object = (QObject *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((object == (QObject *)0x0) || (pQVar6 = this->mobj, pQVar6 == (QMetaObject *)0x0)) ||
     (puVar1 = (this->data).d, (puVar1[2] & 2) == 0)) {
LAB_002844aa:
    sVar8 = 0;
  }
  else {
    puVar2 = (pQVar6->d).data;
    local_60.d_ptr =
         (pQVar6->d).metaTypes
         [(ulong)((int)((ulong)((long)puVar1 - (long)puVar2) >> 2) - puVar2[7]) / 5];
    local_58.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<QVariant>::metaType;
    bVar5 = ::comparesEqual(&local_60,(QMetaType *)&local_58);
    if (!bVar5) {
      local_68 = ::QVariant::metaType((QVariant *)__buf);
      bVar5 = ::comparesEqual(&local_60,&local_68);
      if (!bVar5) {
        if ((((this->mobj != (QMetaObject *)0x0) && (((this->data).d[2] & 8) != 0)) &&
            ((pQVar6 = (this->menum).mobj, pQVar6 != (QMetaObject *)0x0 &&
             ((pQVar6->d).stringdata != (uint *)0x0)))) &&
           (((local_60.d_ptr == (QMetaTypeInterface *)0x0 ||
             ((local_60.d_ptr)->metaObjectFn == (MetaObjectFn)0x0)) ||
            (pQVar6 = (*(local_60.d_ptr)->metaObjectFn)(local_60.d_ptr),
            pQVar6 == (QMetaObject *)0x0)))) {
          local_58.shared = (PrivateShared *)::QVariant::metaType((QVariant *)__buf);
          local_68.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
          bVar5 = ::comparesEqual((QMetaType *)&local_58,&local_68);
          if (bVar5) {
            bVar5 = isFlagType(this);
            if (bVar5) {
              ::QVariant::toByteArray((QByteArray *)&local_58,(QVariant *)__buf);
              pcVar11 = (char *)local_58._8_8_;
              if ((char *)local_58._8_8_ == (char *)0x0) {
                pcVar11 = &QByteArray::_empty;
              }
              _Var12._M_payload.super__Optional_payload_base<unsigned_long_long> =
                   (_Optional_payload<unsigned_long_long,_true,_true,_true>)
                   QMetaEnum::keysToValue64(&this->menum,pcVar11);
            }
            else {
              ::QVariant::toByteArray((QByteArray *)&local_58,(QVariant *)__buf);
              pcVar11 = (char *)local_58._8_8_;
              if ((char *)local_58._8_8_ == (char *)0x0) {
                pcVar11 = &QByteArray::_empty;
              }
              _Var12._M_payload.super__Optional_payload_base<unsigned_long_long> =
                   (_Optional_payload<unsigned_long_long,_true,_true,_true>)
                   QMetaEnum::keyToValue64(&this->menum,pcVar11);
            }
            if ((QMetaTypeInterface *)local_58.shared != (QMetaTypeInterface *)0x0) {
              LOCK();
              ((local_58.shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
              _q_value.super___atomic_base<int>._M_i =
                   ((local_58.shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                   ._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_58.shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                  _q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_58.shared,1,0x10);
              }
            }
            if (((undefined1  [16])
                 _Var12._M_payload.super__Optional_payload_base<unsigned_long_long> &
                (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              ::QVariant::QVariant
                        ((QVariant *)&local_58,
                         _Var12._M_payload.super__Optional_payload_base<unsigned_long_long>.
                         _M_payload);
              ::QVariant::operator=((QVariant *)__buf,(QVariant *)&local_58);
              ::QVariant::~QVariant((QVariant *)&local_58);
            }
          }
        }
        if (*(ulong *)((long)__buf + 0x18) < 4) {
          if ((this->mobj != (QMetaObject *)0x0) && (((this->data).d[2] & 4) != 0)) {
            bVar5 = reset(this,object);
            sVar8 = CONCAT71(extraout_var,bVar5);
            goto LAB_002844ac;
          }
          ::QVariant::QVariant((QVariant *)&local_58,local_60,(void *)0x0);
          ::QVariant::operator=((QVariant *)__buf,(QVariant *)&local_58);
          ::QVariant::~QVariant((QVariant *)&local_58);
        }
        else {
          bVar5 = ::QVariant::convert((QVariant *)__buf,local_60);
          if (!bVar5) goto LAB_002844aa;
        }
      }
    }
    local_58._16_8_ = &local_6c;
    local_6c = -1;
    local_40 = &local_70;
    local_70 = 0;
    local_68.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QVariant>::metaType;
    local_58._8_8_ = __buf;
    bVar5 = ::comparesEqual(&local_60,&local_68);
    if (!bVar5) {
      __buf = ::QVariant::data((QVariant *)__buf);
    }
    pQVar6 = this->mobj;
    puVar1 = (pQVar6->d).data;
    local_58.shared = (PrivateShared *)__buf;
    if (((puVar1[0xc] & 4) == 0) ||
       (p_Var3 = (pQVar6->d).static_metacall, p_Var3 == (StaticMetacallFunction)0x0)) {
      iVar9 = 0;
      for (pQVar6 = (pQVar6->d).superdata.direct; pQVar6 != (QMetaObject *)0x0;
          pQVar6 = (pQVar6->d).superdata.direct) {
        iVar9 = iVar9 + (pQVar6->d).data[6];
      }
      uVar10 = iVar9 + ((int)((ulong)((long)(this->data).d - (long)puVar1) >> 2) - puVar1[7]) / 5;
      pQVar4 = ((object->d_ptr).d)->metaObject;
      if (pQVar4 == (QDynamicMetaObjectData *)0x0) {
        iVar9 = (*object->_vptr_QObject[2])(object,2,(ulong)uVar10,&local_58);
        uVar7 = CONCAT44(extraout_var_01,iVar9);
      }
      else {
        iVar9 = (*pQVar4->_vptr_QDynamicMetaObjectData[4])(pQVar4,object,2,(ulong)uVar10,&local_58);
        uVar7 = CONCAT44(extraout_var_00,iVar9);
      }
    }
    else {
      uVar7 = (*p_Var3)(object,WriteProperty,
                        ((int)((ulong)((long)(this->data).d - (long)puVar1) >> 2) - puVar1[7]) / 5,
                        &local_58.shared);
    }
    sVar8 = CONCAT71((int7)((ulong)uVar7 >> 8),local_6c != 0);
  }
LAB_002844ac:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return sVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaProperty::write(QObject *object, QVariant &&v) const
{
    if (!object || !isWritable())
        return false;
    QMetaType t(mobj->d.metaTypes[data.index(mobj)]);
    if (t != QMetaType::fromType<QVariant>() && t != v.metaType()) {
        if (isEnumType() && !t.metaObject() && v.metaType() == QMetaType::fromType<QString>()) {
            // Assigning a string to a property of type Q_ENUMS (instead of Q_ENUM)
            // means the QMetaType has no associated QMetaObject, so it can't
            // do the conversion (see qmetatype.cpp:convertToEnum()).
            std::optional value = isFlagType() ? menum.keysToValue64(v.toByteArray())
                                               : menum.keyToValue64(v.toByteArray());
            if (value)
                v = QVariant(qlonglong(*value));

            // If the key(s)ToValue64 call failed, the convert() call below
            // gives QMetaType one last chance.
        }
        if (!v.isValid()) {
            if (isResettable())
                return reset(object);
            v = QVariant(t, nullptr);
        } else if (!v.convert(t)) {
            return false;
        }
    }
    // the status variable is changed by qt_metacall to indicate what it did
    // this feature is currently only used by Qt D-Bus and should not be depended
    // upon. Don't change it without looking into QDBusAbstractInterface first
    // -1 (unchanged): normal qt_metacall, result stored in argv[0]
    // changed: result stored directly in value, return the value of status
    int status = -1;
    // the flags variable is used by the declarative module to implement
    // interception of property writes.
    int flags = 0;
    void *argv[] = { nullptr, &v, &status, &flags };
    if (t == QMetaType::fromType<QVariant>())
        argv[0] = &v;
    else
        argv[0] = v.data();
    if (priv(mobj->d.data)->flags & PropertyAccessInStaticMetaCall && mobj->d.static_metacall)
        mobj->d.static_metacall(object, QMetaObject::WriteProperty, data.index(mobj), argv);
    else
        QMetaObject::metacall(object, QMetaObject::WriteProperty, data.index(mobj) + mobj->propertyOffset(), argv);

    return status;
}